

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

const_iterator * __thiscall
ft::mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>::lower_bound
          (const_iterator *__return_storage_ptr__,
          mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this,
          key_type *k)

{
  rbtree *prVar1;
  treeNode<ft::pair<const_int,_float>_> *ptVar2;
  treeNode<ft::pair<const_int,_float>_> *ptVar3;
  const_iterator *it;
  treeNode<ft::pair<const_int,_float>_> *ptVar4;
  treeNode<ft::pair<const_int,_float>_> *ptVar5;
  bool bVar6;
  
  prVar1 = &(this->
            super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
            ).m_tree;
  ptVar4 = ((this->
            super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
            ).m_tree.m_first)->parent;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ).m_tree = prVar1;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ).m_node = ptVar4;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118a98;
  ptVar2 = (this->
           super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
           ).m_tree.m_last;
  bVar6 = ptVar4 == ptVar2;
  if (bVar6) {
LAB_0010dff0:
    (__return_storage_ptr__->
    super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
    ).m_node = ptVar4;
  }
  else {
    if ((ptVar4->value).first < *k) {
      do {
        ptVar3 = ptVar4->right;
        ptVar5 = ptVar4;
        if (ptVar4->right == prVar1->NIL) {
          do {
            ptVar4 = ptVar5->parent;
            bVar6 = ptVar4->right == ptVar5;
            ptVar5 = ptVar4;
          } while (bVar6);
        }
        else {
          do {
            ptVar4 = ptVar3;
            ptVar3 = ptVar4->left;
          } while (ptVar4->left != prVar1->NIL);
        }
        bVar6 = ptVar4 == ptVar2;
        if (bVar6) goto LAB_0010dff0;
      } while ((ptVar4->value).first < *k);
    }
    (__return_storage_ptr__->
    super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
    ).m_node = ptVar4;
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ).m_tree = prVar1;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ).m_node = ptVar2;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118a98;
  return __return_storage_ptr__;
}

Assistant:

const_iterator	lower_bound(key_type const & k) const
	{
		for (const_iterator it = this->begin(); it != this->end(); ++it)
		{
			if (!this->key_comp()(it->first, k)) return it;
		}
		return this->end();
	}